

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::inputFile(Config *this,string *filename)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  string local_38;
  
  if ((((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
     ) {
    QUtil::make_shared_cstr((QUtil *)&local_38,filename);
    sVar3 = local_38._M_string_length;
    _Var2._M_p = local_38._M_dataplus._M_p;
    peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38._M_dataplus._M_p = (pointer)0x0;
    local_38._M_string_length = 0;
    this_00 = (peVar1->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (peVar1->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = _Var2._M_p;
    (peVar1->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length);
    }
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"input file has already been given","");
    usage(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::inputFile(std::string const& filename)
{
    if (o.m->infilename == nullptr) {
        o.m->infilename = QUtil::make_shared_cstr(filename);
    } else {
        usage("input file has already been given");
    }
    return this;
}